

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

uint __thiscall llvm::yaml::Input::beginSequence(Input *this)

{
  HNode *hnode;
  bool bVar1;
  size_type sVar2;
  StringRef S;
  Twine local_50;
  StringRef local_38;
  ret_type local_28;
  ScalarHNode *SN;
  SequenceHNode *SQ;
  Input *this_local;
  
  SQ = (SequenceHNode *)this;
  SN = (ScalarHNode *)
       dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if ((ret_type)SN == (ret_type)0x0) {
    bVar1 = isa<llvm::yaml::Input::EmptyHNode,llvm::yaml::Input::HNode*>(&this->CurrentNode);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      local_28 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>
                           (this->CurrentNode);
      if (local_28 != (ret_type)0x0) {
        local_38 = ScalarHNode::value(local_28);
        S.Length = (char *)local_38.Length;
        S.Data = S.Length;
        bVar1 = isNull((yaml *)local_38.Data,S);
        if (bVar1) {
          return 0;
        }
      }
      hnode = this->CurrentNode;
      Twine::Twine(&local_50,"not a sequence");
      setError(this,hnode,&local_50);
      this_local._4_4_ = 0;
    }
  }
  else {
    sVar2 = std::
            vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
            ::size(&((ret_type)SN)->Entries);
    this_local._4_4_ = (uint)sVar2;
  }
  return this_local._4_4_;
}

Assistant:

unsigned Input::beginSequence() {
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode))
    return SQ->Entries.size();
  if (isa<EmptyHNode>(CurrentNode))
    return 0;
  // Treat case where there's a scalar "null" value as an empty sequence.
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (isNull(SN->value()))
      return 0;
  }
  // Any other type of HNode is an error.
  setError(CurrentNode, "not a sequence");
  return 0;
}